

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

ResetPtr __thiscall libcellml::AnyCellmlElement::reset(AnyCellmlElement *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  undefined8 *in_RSI;
  shared_ptr<libcellml::Reset> sVar1;
  ResetPtr RVar2;
  
  if (*(int *)*in_RSI - 8U < 3) {
    sVar1 = std::any_cast<std::shared_ptr<libcellml::Reset>>((any *)this);
    in_RDX = sVar1.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
  }
  else {
    this->mPimpl = (AnyCellmlElementImpl *)0x0;
    this[1].mPimpl = (AnyCellmlElementImpl *)0x0;
  }
  RVar2.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  RVar2.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ResetPtr)RVar2.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ResetPtr AnyCellmlElement::reset() const
{
    if ((mPimpl->mType == CellmlElementType::RESET)
        || (mPimpl->mType == CellmlElementType::RESET_VALUE)
        || (mPimpl->mType == CellmlElementType::TEST_VALUE)) {
        try {
            return std::any_cast<ResetPtr>(mPimpl->mItem);
        } catch (const std::bad_any_cast &) {
            return nullptr;
        }
    }

    return nullptr;
}